

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_add_channel(exr_context_t ctxt,int part_index,char *name,exr_pixel_type_t ptype,
               exr_perceptual_treatment_t islinear,int32_t xsamp,int32_t ysamp)

{
  int32_t in_EDX;
  int in_ESI;
  char *in_RDI;
  undefined4 in_R9D;
  exr_attribute_list_t *unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  exr_priv_part_t part;
  exr_result_t rv;
  exr_attribute_t *attr;
  undefined4 in_stack_ffffffffffffffb0;
  int32_t in_stack_ffffffffffffffb4;
  long lVar1;
  uint in_stack_ffffffffffffffc0;
  exr_result_t eVar2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar2 = 0;
  if (in_RDI == (char *)0x0) {
    eVar2 = 2;
  }
  else {
    internal_exr_lock((exr_const_context_t)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock((exr_const_context_t)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      eVar2 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (*in_RDI == '\0') {
        internal_exr_unlock((exr_const_context_t)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        eVar2 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
      }
      else if (*in_RDI == '\x03') {
        internal_exr_unlock((exr_const_context_t)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        eVar2 = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
      }
      else {
        if (*(long *)(lVar1 + 0x20) == 0) {
          eVar2 = exr_attr_list_add((exr_context_t)CONCAT44(in_stack_0000000c,in_stack_00000008),
                                    unaff_retaddr,
                                    (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                     in_stack_fffffffffffffff8),
                                    (exr_attribute_type_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,
                                    (uint8_t **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                    (exr_attribute_t **)attr);
        }
        else if (*(int *)(*(long *)(lVar1 + 0x20) + 0x14) != 3) {
          internal_exr_unlock((exr_const_context_t)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          eVar2 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             *(undefined8 *)(*(long *)(lVar1 + 0x20) + 8),"channels");
          return eVar2;
        }
        if (eVar2 == 0) {
          eVar2 = exr_attr_chlist_add((exr_context_t)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                                      *(exr_attr_chlist_t **)(lVar1 + 0x20),
                                      (char *)(ulong)in_stack_ffffffffffffffc0,
                                      (exr_pixel_type_t)((ulong)lVar1 >> 0x20),
                                      (exr_perceptual_treatment_t)lVar1,in_stack_ffffffffffffffb4,
                                      in_EDX);
        }
        internal_exr_unlock((exr_const_context_t)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      }
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_add_channel (
    exr_context_t              ctxt,
    int                        part_index,
    const char*                name,
    exr_pixel_type_t           ptype,
    exr_perceptual_treatment_t islinear,
    int32_t                    xsamp,
    int32_t                    ysamp)
{
    REQ_ATTR_FIND_CREATE (channels, EXR_ATTR_CHLIST);
    if (rv == EXR_ERR_SUCCESS)
    {
        rv = exr_attr_chlist_add (
            ctxt, attr->chlist, name, ptype, islinear, xsamp, ysamp);
    }
    return EXR_UNLOCK_AND_RETURN (rv);
}